

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void read_tri_vlist(char *filename,vertex_list_t *vlist)

{
  byte bVar1;
  ostream *poVar2;
  runtime_error *this;
  void *pvVar3;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *pDVar4;
  Scalar *pSVar5;
  uint local_3f0;
  uint i;
  stringstream local_3c8 [8];
  stringstream ss;
  ostream local_3b8 [392];
  undefined1 local_230 [8];
  fstream tri_file;
  uint local_20;
  uint local_1c;
  uint num_t;
  uint num_v;
  vertex_list_t *vlist_local;
  char *filename_local;
  
  _num_t = vlist;
  vlist_local = (vertex_list_t *)filename;
  std::fstream::fstream(local_230,filename,_S_in);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_3c8);
    poVar2 = std::operator<<(local_3b8,"Failed to ensure condition ");
    poVar2 = std::operator<<(poVar2,"tri_file.is_open()");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"at (");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/main.cpp"
                            );
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = std::operator<<(poVar2,"read_tri_vlist");
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x6c);
    poVar2 = std::operator<<(poVar2,") \n ");
    poVar2 = std::operator<<(poVar2,"Message : ");
    poVar2 = std::operator<<(poVar2,"\"unable to open tri file\"");
    std::operator<<(poVar2,"\n");
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this,(string *)&i);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar3 = (void *)std::istream::operator>>(local_230,&local_1c);
  std::istream::operator>>(pvVar3,&local_20);
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::resize(_num_t,(ulong)local_1c);
  for (local_3f0 = 0; local_3f0 < local_1c; local_3f0 = local_3f0 + 1) {
    pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
             std::
             vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ::operator[](_num_t,(ulong)local_3f0);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[](pDVar4,0);
    pvVar3 = (void *)std::istream::operator>>(local_230,pSVar5);
    pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
             std::
             vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ::operator[](_num_t,(ulong)local_3f0);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[](pDVar4,1);
    pvVar3 = (void *)std::istream::operator>>(pvVar3,pSVar5);
    pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
             std::
             vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ::operator[](_num_t,(ulong)local_3f0);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[](pDVar4,2);
    std::istream::operator>>(pvVar3,pSVar5);
  }
  std::fstream::close();
  std::fstream::~fstream(local_230);
  return;
}

Assistant:

void read_tri_vlist( const char *filename,tri_cc_geom_t::vertex_list_t &vlist)
{
  uint num_v,num_t;

  std::fstream tri_file ( filename, std::fstream::in );

  ENSURE(tri_file.is_open(),"unable to open tri file");

  tri_file >> num_v >> num_t;

  vlist.resize(num_v);

  for ( uint i = 0; i < num_v; ++i )
    tri_file>>vlist[i][0]
            >>vlist[i][1]
            >>vlist[i][2];


  tri_file.close();
}